

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

void Js::JavascriptArray::InsertionSort<StringItem>
               (StringItem *list,uint32 length,CompareVarsInfo *cvInfo)

{
  _func_bool_CompareVarsInfo_ptr_void_ptr_void_ptr *p_Var1;
  bool bVar2;
  undefined1 local_48 [8];
  StringItem item;
  uint32 upperBound;
  uint32 insertPoint;
  uint32 lowerBound;
  uint32 sortedCount;
  _func_bool_CompareVarsInfo_ptr_void_ptr_void_ptr *compareType;
  CompareVarsInfo *cvInfo_local;
  uint32 length_local;
  StringItem *list_local;
  
  p_Var1 = cvInfo->compareType;
  insertPoint = 1;
  item.StringValue.ptr._4_4_ = 0;
  item.StringValue.ptr._0_4_ = 0;
  StringItem::StringItem((StringItem *)local_48);
  for (; insertPoint < length; insertPoint = insertPoint + 1) {
    StringItem::operator=((StringItem *)local_48,list + insertPoint);
    item.StringValue.ptr._0_4_ = insertPoint;
    item.StringValue.ptr._4_4_ = insertPoint - 1;
    upperBound = 0;
    while( true ) {
      bVar2 = (*p_Var1)(cvInfo,local_48,list + item.StringValue.ptr._4_4_);
      if (bVar2) {
        item.StringValue.ptr._0_4_ = item.StringValue.ptr._4_4_;
      }
      else {
        upperBound = item.StringValue.ptr._4_4_ + 1;
      }
      if ((uint)item.StringValue.ptr <= upperBound) break;
      item.StringValue.ptr._4_4_ = upperBound + ((uint)item.StringValue.ptr - upperBound >> 1);
    }
    for (item.StringValue.ptr._4_4_ = insertPoint; upperBound < item.StringValue.ptr._4_4_;
        item.StringValue.ptr._4_4_ = item.StringValue.ptr._4_4_ - 1) {
      StringItem::operator=
                (list + item.StringValue.ptr._4_4_,list + (item.StringValue.ptr._4_4_ - 1));
    }
    StringItem::operator=(list + upperBound,(StringItem *)local_48);
  }
  return;
}

Assistant:

void JavascriptArray::InsertionSort(T* list, uint32 length, JavascriptArray::CompareVarsInfo* cvInfo)
    {
        bool (*compareType)(JavascriptArray::CompareVarsInfo*, const void*, const void*) = cvInfo->compareType;
        uint32 sortedCount = 1, lowerBound = 0, insertPoint = 0, upperBound = 0;
        T item;
        while (sortedCount < length)
        {
            item = list[sortedCount];
            upperBound = sortedCount;
            insertPoint = sortedCount - 1; // this lets us check for already ordered first
            lowerBound = 0;
            for (;;)
            {
                if (compareType (cvInfo, &item, &list[insertPoint]) )
                {
                    upperBound = insertPoint;
                }
                else
                {
                    lowerBound = insertPoint + 1;
                }
                if (lowerBound >= upperBound)
                {
                    break;
                }
                insertPoint = lowerBound + ((upperBound - lowerBound) / 2);
            }
            insertPoint = sortedCount;
            while (insertPoint > lowerBound)
            {
                list[insertPoint] = list[insertPoint - 1];
                --insertPoint;
            }
            list[lowerBound] = item;
            ++sortedCount;
        }
    }